

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
               (tuple<long,_int,_int,_int> *begin,
               __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
               end,int param_3,byte param_4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Tuple_impl<2UL,_int,_int> _Var5;
  long lVar6;
  bool bVar7;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var8;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  tuple<long,_int,_int,_int> *ptVar14;
  tuple<long,_int,_int,_int> *ptVar15;
  tuple<long,_int,_int,_int> *ptVar16;
  tuple<long,_int,_int,_int> *ptVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  pair<__gnu_cxx::__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>,_bool>
  pVar22;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> __cmp_1;
  int local_74;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> local_62;
  _Iter_comp_iter<std::less<std::tuple<long,_int,_int,_int>_>_> local_61;
  tuple<long,_int,_int,_int> *local_60;
  tuple<long,_int,_int,_int> *local_58;
  tuple<long,_int,_int,_int> *local_50;
  tuple<long,_int,_int,_int> *local_48;
  tuple<long,_int,_int,_int> *local_40;
  ulong local_38;
  
  uVar10 = (long)end._M_current - (long)begin;
  if ((long)uVar10 < 0x240) {
    if (param_4 == 0) {
LAB_00325b38:
      ptVar16 = begin + 1;
      if (begin + 1 == end._M_current || begin == end._M_current) {
        return;
      }
      do {
        ptVar14 = ptVar16;
        bVar7 = std::
                __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                ::__less(ptVar14,begin);
        if (bVar7) {
          iVar1 = (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
          iVar2 = begin[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Head_base<2UL,_int,_false>._M_head_impl;
          iVar3 = begin[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                  _M_head_impl;
          lVar11 = begin[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
          do {
            do {
              ptVar16 = begin;
              ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              lVar21 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              begin = ptVar16 + -1;
            } while (lVar11 < lVar21);
          } while ((lVar11 <= lVar21) &&
                  ((iVar13 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>
                             ._M_head_impl, iVar3 < iVar13 ||
                   ((iVar3 <= iVar13 &&
                    ((iVar13 = ptVar16[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                               super__Tuple_impl<1UL,_int,_int,_int>.
                               super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>.
                               _M_head_impl, iVar2 < iVar13 ||
                     ((iVar2 <= iVar13 &&
                      (iVar1 < (begin->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                               super__Tuple_impl<1UL,_int,_int,_int>.
                               super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                               super__Head_base<3UL,_int,_false>._M_head_impl))))))))));
          (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
          _M_head_impl = lVar11;
          (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               iVar3;
          (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
          (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
          super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
        }
        ptVar16 = ptVar14 + 1;
        begin = ptVar14;
      } while (ptVar14 + 1 != end._M_current);
      return;
    }
  }
  else {
    local_50 = end._M_current + -1;
    local_40 = end._M_current + -2;
    local_48 = end._M_current + -3;
    _Var9._M_current = begin;
    local_74 = param_3;
    do {
      uVar12 = (uVar10 >> 3) * -0x5555555555555555;
      uVar20 = uVar12 >> 1;
      ptVar16 = _Var9._M_current + uVar20;
      if (uVar10 < 0xc01) {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (ptVar16,_Var9._M_current,local_50);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (_Var9._M_current,ptVar16,local_50);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (_Var9._M_current + 1,_Var9._M_current + (uVar20 - 1),local_40);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (_Var9._M_current + 2,_Var9._M_current + uVar20 + 1,local_48);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (_Var9._M_current + (uVar20 - 1),ptVar16,_Var9._M_current + uVar20 + 1);
        lVar11 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                 super__Head_base<0UL,_long,_false>._M_head_impl;
        ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Head_base<0UL,_long,_false>._M_head_impl =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Head_base<0UL,_long,_false>._M_head_impl;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
        _M_head_impl = lVar11;
        iVar1 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
        ;
        ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Head_base<1UL,_int,_false>._M_head_impl = iVar1;
        _Var5 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
        ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
             (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int> = _Var5;
      }
      if (((param_4 & 1) != 0) ||
         (bVar7 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(_Var9._M_current + -1,_Var9._M_current), bVar7)) {
        pVar22 = partition_right<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                           (_Var9._M_current,end._M_current);
        _Var8 = pVar22.first._M_current;
        uVar20 = ((long)_Var8._M_current - (long)_Var9._M_current >> 3) * -0x5555555555555555;
        begin = _Var8._M_current + 1;
        local_38 = (long)end._M_current - (long)begin;
        uVar10 = ((long)local_38 >> 3) * -0x5555555555555555;
        uVar12 = uVar12 >> 3;
        if (((long)uVar20 < (long)uVar12) || ((long)uVar10 < (long)uVar12)) {
          local_74 = local_74 + -1;
          if (local_74 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::tuple<long,int,int,int>>>>
                      (_Var9,end,&local_62);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::tuple<long,int,int,int>>>>
                      (_Var9,end,&local_61);
            return;
          }
          if (0x228 < (long)_Var8._M_current - (long)_Var9._M_current) {
            uVar12 = uVar20 >> 2;
            lVar11 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
            iVar1 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var9._M_current[uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            lVar11 = _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
            iVar1 = _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var8._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var8._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            if (0x80 < uVar20) {
              lVar11 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar11 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var9._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              uVar20 = ~uVar12;
              lVar11 = _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[uVar20].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar21 = -2 - uVar12;
              lVar11 = _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            }
          }
          if (0x228 < (long)local_38) {
            uVar12 = uVar10 >> 2;
            lVar11 = _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
            iVar1 = _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var8._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            _Var8._M_current[uVar12 + 1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            lVar11 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl =
                 end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
            end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
            iVar1 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar1;
            _Var5 = end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            end._M_current[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            end._M_current[-uVar12].super__Tuple_impl<0UL,_long,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            if (0x80 < uVar10) {
              lVar11 = _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[uVar12 + 2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar11 = _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              _Var8._M_current[uVar12 + 3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              uVar10 = ~uVar12;
              lVar11 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[-2].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[uVar10].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
              lVar21 = -2 - uVar12;
              lVar11 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar11;
              iVar1 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar1;
              _Var5 = end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[-3].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                   end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
              end._M_current[lVar21].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var5;
            }
          }
        }
        else if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_60 = _Var9._M_current;
          local_58 = _Var8._M_current;
          if (_Var9._M_current + 1 != _Var8._M_current && _Var9._M_current != _Var8._M_current) {
            lVar11 = 0;
            uVar10 = 0;
            ptVar16 = _Var9._M_current + 1;
            do {
              ptVar14 = ptVar16;
              bVar7 = std::
                      __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                      ::__less(ptVar14,_Var9._M_current);
              if (bVar7) {
                iVar1 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
                iVar2 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl;
                iVar3 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl;
                lVar21 = _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
                (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Head_base<0UL,_long,_false>._M_head_impl =
                     ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Head_base<0UL,_long,_false>._M_head_impl;
                (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl =
                     ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                     super__Head_base<2UL,_int,_false>._M_head_impl;
                _Var9._M_current[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                     ((_Var9._M_current)->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                     super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
                ptVar16 = local_60;
                ptVar15 = ptVar14;
                ptVar17 = ptVar14 + -1;
                lVar18 = lVar11;
                if (ptVar14 + -1 != local_60) {
                  do {
                    lVar19 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                             super__Head_base<0UL,_long,_false>._M_head_impl;
                    if (lVar21 < lVar19) {
                      iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                               super__Tuple_impl<1UL,_int,_int,_int>.
                               super__Head_base<1UL,_int,_false>._M_head_impl;
                    }
                    else {
                      ptVar16 = ptVar17;
                      if (lVar19 < lVar21) break;
                      iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                               super__Tuple_impl<1UL,_int,_int,_int>.
                               super__Head_base<1UL,_int,_false>._M_head_impl;
                      if (iVar13 <= iVar3) {
                        if (iVar13 < iVar3) break;
                        iVar4 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                super__Tuple_impl<1UL,_int,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>.
                                _M_head_impl;
                        if (iVar4 <= iVar2) {
                          if (iVar4 < iVar2) {
                            ptVar15 = ptVar17 + 1;
                            break;
                          }
                          if (ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                              .super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                              _M_head_impl <= iVar1) break;
                        }
                      }
                    }
                    (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Head_base<0UL,_long,_false>._M_head_impl = lVar19;
                    (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl = iVar13;
                    (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                         ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                    lVar18 = lVar18 + 0x18;
                    ptVar16 = local_60;
                    ptVar15 = ptVar17;
                    ptVar17 = ptVar17 + -1;
                  } while (lVar18 != 0);
                }
                ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Head_base<0UL,_long,_false>._M_head_impl = lVar21;
                ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = iVar3;
                ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
                (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
                uVar10 = uVar10 + ((long)ptVar14 - (long)ptVar16 >> 3) * -0x5555555555555555;
                _Var9._M_current = local_60;
                _Var8._M_current = local_58;
                if (8 < uVar10) goto LAB_00325afc;
              }
              lVar11 = lVar11 + -0x18;
              ptVar16 = ptVar14 + 1;
              _Var9._M_current = ptVar14;
            } while (ptVar14 + 1 != local_58);
          }
          if (begin == end._M_current) {
            return;
          }
          if (local_58 + 2 == end._M_current) {
            return;
          }
          lVar11 = 0x30;
          lVar21 = 0;
          uVar10 = 0;
          ptVar16 = begin;
          do {
            ptVar14 = (tuple<long,_int,_int,_int> *)
                      ((long)&(local_58->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                              .super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                              _M_head_impl + lVar11);
            bVar7 = std::
                    __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                    ::__less(ptVar14,ptVar16);
            if (bVar7) {
              iVar1 = (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                      super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
              iVar2 = ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                      super__Head_base<2UL,_int,_false>._M_head_impl;
              iVar3 = ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                      _M_head_impl;
              lVar18 = ptVar16[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
              (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
              super__Head_base<0UL,_long,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Head_base<0UL,_long,_false>._M_head_impl;
              (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                   _M_head_impl;
              (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
              super__Head_base<2UL,_int,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                   super__Head_base<2UL,_int,_false>._M_head_impl;
              (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
              super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                   (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                   super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
              ptVar16 = begin;
              ptVar15 = ptVar14;
              if (lVar11 != 0x30) {
                ptVar17 = (tuple<long,_int,_int,_int> *)
                          ((long)&local_58[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                                  super__Tuple_impl<1UL,_int,_int,_int>.
                                  super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                  super__Head_base<3UL,_int,_false>._M_head_impl + lVar11);
                lVar19 = lVar21;
                do {
                  lVar6 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                          super__Head_base<0UL,_long,_false>._M_head_impl;
                  if (lVar18 < lVar6) {
                    iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>
                             ._M_head_impl;
                  }
                  else {
                    ptVar16 = ptVar17;
                    if (lVar6 < lVar18) break;
                    iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>
                             ._M_head_impl;
                    if (iVar13 <= iVar3) {
                      if (iVar13 < iVar3) break;
                      iVar4 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                              .super__Head_base<2UL,_int,_false>._M_head_impl;
                      if (iVar4 <= iVar2) {
                        if (iVar4 < iVar2) {
                          ptVar15 = ptVar17 + 1;
                          break;
                        }
                        if (ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                            _M_head_impl <= iVar1) break;
                      }
                    }
                  }
                  (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                  super__Head_base<0UL,_long,_false>._M_head_impl = lVar6;
                  (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                  _M_head_impl = iVar13;
                  (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                       ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
                  lVar19 = lVar19 + 0x18;
                  ptVar16 = begin;
                  ptVar15 = ptVar17;
                  ptVar17 = ptVar17 + -1;
                } while (lVar19 != 0);
              }
              ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Head_base<0UL,_long,_false>._M_head_impl = lVar18;
              ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar3;
              ptVar15[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
              super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
              (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
              super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
              uVar10 = uVar10 + ((long)ptVar14 - (long)ptVar16 >> 3) * -0x5555555555555555;
              _Var9._M_current = local_60;
              _Var8._M_current = local_58;
              if (8 < uVar10) break;
            }
            ptVar15 = (tuple<long,_int,_int,_int> *)
                      ((long)&local_58[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                              .super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                              _M_head_impl + lVar11);
            lVar11 = lVar11 + 0x18;
            lVar21 = lVar21 + -0x18;
            ptVar16 = ptVar14;
            if (ptVar15 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00325afc:
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
                  (_Var9._M_current,_Var8._M_current,local_74,param_4 & 1);
        param_4 = 0;
        uVar10 = local_38;
      }
      else {
        _Var9 = partition_left<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                          (_Var9._M_current,end._M_current);
        begin = _Var9._M_current + 1;
        uVar10 = (long)end._M_current - (long)begin;
      }
      _Var9._M_current = begin;
    } while (0x23f < (long)uVar10);
    if ((param_4 & 1) == 0) goto LAB_00325b38;
  }
  if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar11 = 0;
    ptVar16 = begin + 1;
    ptVar14 = begin;
    do {
      ptVar15 = ptVar16;
      bVar7 = std::
              __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
              ::__less(ptVar15,ptVar14);
      if (bVar7) {
        iVar1 = ptVar14[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        iVar2 = ptVar14[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl;
        iVar3 = ptVar14[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
        ;
        lVar21 = ptVar14[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Head_base<0UL,_long,_false>._M_head_impl;
        (ptVar15->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
        _M_head_impl = (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                       super__Head_base<0UL,_long,_false>._M_head_impl;
        (ptVar15->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Head_base<1UL,_int,_false>._M_head_impl =
             (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        (ptVar15->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
             super__Head_base<2UL,_int,_false>._M_head_impl;
        ptVar14[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (ptVar14->super__Tuple_impl<0UL,_long,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
             super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        ptVar16 = begin;
        ptVar14 = ptVar15;
        ptVar17 = ptVar15 + -1;
        lVar18 = lVar11;
        if (ptVar15 + -1 != begin) {
          do {
            lVar19 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                     super__Head_base<0UL,_long,_false>._M_head_impl;
            if (lVar21 < lVar19) {
              iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
            }
            else {
              ptVar16 = ptVar17;
              if (lVar19 < lVar21) break;
              iVar13 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
              if (iVar13 <= iVar3) {
                if (iVar13 < iVar3) break;
                iVar4 = ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl;
                if (iVar4 <= iVar2) {
                  if (iVar4 < iVar2) {
                    ptVar14 = ptVar17 + 1;
                    break;
                  }
                  if (ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                      super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl <=
                      iVar1) break;
                }
              }
            }
            (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Head_base<0UL,_long,_false>._M_head_impl = lVar19;
            (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar13;
            (ptVar17->super__Tuple_impl<0UL,_long,_int,_int,_int>).
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
                 ptVar17[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
            lVar18 = lVar18 + 0x18;
            ptVar16 = begin;
            ptVar14 = ptVar17;
            ptVar17 = ptVar17 + -1;
          } while (lVar18 != 0);
        }
        ptVar14[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Head_base<0UL,_long,_false>.
        _M_head_impl = lVar21;
        ptVar14[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl = iVar3
        ;
        ptVar14[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
        super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
        (ptVar16->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl = iVar1;
      }
      lVar11 = lVar11 + -0x18;
      ptVar16 = ptVar15 + 1;
      ptVar14 = ptVar15;
    } while (ptVar15 + 1 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }